

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O2

void VerticalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  int iVar1;
  
  *filtered_data = *data;
  PredictLine_C(data + 1,data,filtered_data + 1,width + -1);
  for (iVar1 = 1; iVar1 < height; iVar1 = iVar1 + 1) {
    filtered_data = filtered_data + stride;
    PredictLine_C(data + stride,data,filtered_data,width);
    data = data + stride;
  }
  return;
}

Assistant:

static void VerticalFilter_C(const uint8_t* WEBP_RESTRICT data,
                             int width, int height, int stride,
                             uint8_t* WEBP_RESTRICT filtered_data) {
  DoVerticalFilter_C(data, width, height, stride, filtered_data);
}